

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed.cc
# Opt level: O2

bool tinyusdz::tydra::
     EvaluateTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
               (Stage *stage,
               TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
               *tattr,string *attr_name,
               vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
               *value_out,string *err)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  ostringstream ss_e;
  TerminalAttributeValue value;
  allocator local_5a9;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string local_548 [32];
  undefined1 local_528 [96];
  bool local_4c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_4a0 [22];
  TerminalAttributeValue local_280;
  
  if (value_out ==
      (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    poVar2 = ::std::operator<<((ostream *)local_528,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"EvaluateTypedAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x88);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_528,"`value_out` param is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
  }
  else if ((tattr->_blocked == true) ||
          (args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out,
          bVar1 = TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                  ::is_value_empty(tattr), bVar1)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if (((tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
         .super__Vector_impl_data._M_finish !=
         (tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
         .super__Vector_impl_data._M_start) && (((tattr->_attrib).has_value_ & 1U) == 0)) {
      Attribute::Attribute((Attribute *)local_528);
      if (tattr->_blocked == true) {
        local_4c8 = true;
        local_528._32_4_ = Uniform;
      }
      else {
        bVar1 = TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                ::is_value_empty(tattr);
        if (((bVar1) ||
            ((tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish ==
             (tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start)) || (((tattr->_attrib).has_value_ & 1U) != 0)
           ) {
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
          ::type_name_abi_cxx11_();
          ::std::__cxx11::string::_M_assign((string *)(local_528 + 0x28));
          ::std::__cxx11::string::_M_dispose();
          local_528._32_4_ = Uniform;
        }
        else {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (local_4a0,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&tattr->_paths);
        }
      }
      TerminalAttributeValue::TerminalAttributeValue(&local_280);
      args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar1 = EvaluateAttribute(stage,(Attribute *)local_528,attr_name,&local_280,err,NAN,Held);
      if (bVar1) {
        __x = TerminalAttributeValue::
              as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                        (&local_280);
        if (__x == (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   0x0) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::string
                      (local_548,
                       "Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}"
                       ,&local_5a9);
            TerminalAttributeValue::type_name_abi_cxx11_(&local_568,&local_280);
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_5a8,(fmt *)local_548,&local_568,&local_588,attr_name,args_2);
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          TerminalAttributeValue::~TerminalAttributeValue(&local_280);
          Attribute::~Attribute((Attribute *)local_528);
          return false;
        }
        ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
        operator=(value_out,__x);
      }
      TerminalAttributeValue::~TerminalAttributeValue(&local_280);
      Attribute::~Attribute((Attribute *)local_528);
      return bVar1;
    }
    bVar1 = TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
            ::get_value(tattr,value_out);
    if (bVar1) {
      return true;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&local_280,"[Internal error] Invalid TypedAttribute? : {} \n",
                 (allocator *)&local_5a8);
      fmt::format<std::__cxx11::string>
                ((string *)local_528,(fmt *)&local_280,(string *)attr_name,args);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  return false;
}

Assistant:

bool EvaluateTypedAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<T> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else if (tattr.is_connection()) {

    // Follow targetPath 
    Attribute attr = ToAttributeConnection(tattr);

    //std::set<std::string> visited_paths;

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 value::TimeCode::Default(), value::TimeSampleInterpolationType::Held);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}", value.type_name(), tattr.type_name(), attr_name);
    }

  } else {
    if (tattr.get_value(value_out)) {
      return true;
    }

    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}